

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeNF
          (ChElementBeamANCF_3243 *this,double xi,double eta,double zeta,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  undefined8 uVar1;
  double dVar2;
  Product<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
  PVar3;
  undefined1 auVar4 [16];
  double *pdVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  void *pvVar17;
  ulong uVar18;
  long lVar19;
  undefined8 *puVar20;
  double *pdVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  Product<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
  *src;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ChMatrix33<double> J_Cxi;
  VectorN G_C;
  VectorN G_B;
  VectorN G_A;
  VectorN Sxi_compact;
  ChMatrix33<double> J_Cxi_Inv;
  MatrixNx3c Sxi_D;
  MatrixNx3 QiCompact;
  Matrix3xN e_bar;
  double dStack_558;
  double *local_550;
  double local_548;
  undefined1 local_540 [16];
  undefined8 local_530;
  undefined8 local_528;
  double dStack_520;
  undefined8 local_518;
  double local_510;
  ulong uStack_508;
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  assign_op<double,_double> local_400 [64];
  undefined1 local_3c0 [64];
  VectorN local_380;
  Matrix<double,_3,_3,_1,_3,_3> local_310;
  undefined1 local_2c0 [128];
  undefined1 local_240 [64];
  Matrix<double,_8,_3,_1,_8,_3> local_200;
  Product<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
  local_140 [4];
  
  local_500._0_8_ = xi;
  local_4c0._0_8_ = eta;
  local_480._0_8_ = zeta;
  local_550 = detJ;
  Calc_Sxi_compact(this,&local_380,xi,eta,zeta);
  lVar19 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (2 < lVar19) {
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
    m_data = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    src = local_140;
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
    m_rows.m_value = 3;
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    m_startRow.m_value = 0;
    local_140[0].m_lhs = &local_380;
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr =
         F;
    local_140[0].m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    m_outerStride = lVar19;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,8,3,1,8,3>,Eigen::Product<Eigen::Matrix<double,8,1,0,8,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>,Eigen::internal::assign_op<double,double>>
              (&local_200,src,(assign_op<double,_double> *)local_2c0,(type)0x0);
    pdVar21 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        0x18) {
      if (pdVar21 != (double *)0x0) {
        free((void *)pdVar21[-1]);
      }
      pvVar17 = malloc(0x100);
      if (pvVar17 == (void *)0x0) {
        puVar20 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar20 = std::ostream::_M_insert<bool>;
        __cxa_throw(puVar20,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      *(void **)(((ulong)pvVar17 & 0xffffffffffffffc0) + 0x38) = pvVar17;
      pdVar21 = (double *)(((ulong)pvVar17 & 0xffffffffffffffc0) + 0x40);
      (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           pdVar21;
      (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x18;
    }
    uVar18 = 0xfffffffffffffff8;
    do {
      dVar35 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar18 + 9];
      dVar36 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar18 + 10];
      dVar2 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array[uVar18 + 0xb];
      dVar11 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar18 + 0xc];
      dVar12 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar18 + 0xd];
      dVar13 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar18 + 0xe];
      dVar14 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
               m_data.array[uVar18 + 0xf];
      pdVar5 = pdVar21 + uVar18 + 8;
      *pdVar5 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[uVar18 + 8];
      pdVar5[1] = dVar35;
      pdVar5[2] = dVar36;
      pdVar5[3] = dVar2;
      pdVar5[4] = dVar11;
      pdVar5[5] = dVar12;
      pdVar5[6] = dVar13;
      pdVar5[7] = dVar14;
      uVar18 = uVar18 + 8;
    } while (uVar18 < 0x10);
    CalcCoordMatrix(this,(Matrix3xN *)src);
    Calc_Sxi_D(this,(MatrixNx3c *)local_2c0,(double)local_500._0_8_,(double)local_4c0._0_8_,
               (double)local_480._0_8_);
    lVar19 = 0x10;
    do {
      PVar3 = *src;
      src = src + 1;
      auVar29 = vmulpd_avx512f((undefined1  [64])PVar3,local_2c0._0_64_);
      auVar26 = vextractf64x4_avx512f(auVar29,1);
      auVar30 = vmulpd_avx512f((undefined1  [64])PVar3,local_2c0._64_64_);
      auVar31 = vmulpd_avx512f((undefined1  [64])PVar3,local_240);
      auVar27 = vextractf64x4_avx512f(auVar30,1);
      auVar28 = vextractf64x4_avx512f(auVar31,1);
      *(double *)((long)&dStack_558 + lVar19) =
           auVar29._0_8_ + auVar26._0_8_ + auVar29._8_8_ + auVar26._8_8_ +
           auVar29._16_8_ + auVar26._16_8_ + auVar29._24_8_ + auVar26._24_8_;
      *(double *)((long)&local_550 + lVar19) =
           auVar30._0_8_ + auVar27._0_8_ + auVar30._8_8_ + auVar27._8_8_ +
           auVar30._16_8_ + auVar27._16_8_ + auVar30._24_8_ + auVar27._24_8_;
      dVar35 = auVar31._0_8_ + auVar28._0_8_ + auVar31._8_8_ + auVar28._8_8_;
      dVar36 = auVar31._16_8_ + auVar28._16_8_ + auVar31._24_8_ + auVar28._24_8_;
      auVar24._0_8_ = dVar35 + dVar36;
      auVar24._8_8_ = dVar35 + dVar36;
      uVar1 = vmovlpd_avx(auVar24);
      *(undefined8 *)(local_540 + lVar19 + -8) = uVar1;
      lVar19 = lVar19 + 0x18;
    } while (lVar19 != 0x58);
    local_500 = local_2c0._0_64_;
    local_4c0 = local_2c0._64_64_;
    local_480 = local_240;
    local_3c0._0_8_ = &local_548;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_310,(SrcXprType *)local_3c0,local_400);
    auVar29._8_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar29._0_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar29._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar29._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar29._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar29._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar29._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar29._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar29 = vmulpd_avx512f(local_500,auVar29);
    auVar30._8_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar30._0_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar30._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar30._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar30._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar30._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar30._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar30._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar30 = vmulpd_avx512f(local_4c0,auVar30);
    auVar31._8_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar31._0_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar31._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar31._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar31._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar31._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar31._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar31._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar31 = vmulpd_avx512f(local_480,auVar31);
    auVar32._8_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar32._0_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar32._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar32._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar32._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar32._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar32._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar32._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar32 = vmulpd_avx512f(local_500,auVar32);
    auVar33._8_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar33._0_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar33._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar33._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar33._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar33._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar33._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar33._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar33 = vmulpd_avx512f(local_500,auVar33);
    auVar29 = vaddpd_avx512f(auVar29,auVar30);
    auVar34._8_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar34._0_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar34._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar34._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar34._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar34._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar34._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar34._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar30 = vmulpd_avx512f(local_4c0,auVar34);
    auVar8._8_8_ = local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[5];
    auVar8._0_8_ = local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[5];
    auVar8._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar8._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar8._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar8._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar8._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar8._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar34 = vmulpd_avx512f(local_4c0,auVar8);
    local_3c0 = vaddpd_avx512f(auVar29,auVar31);
    auVar29 = vaddpd_avx512f(auVar32,auVar30);
    auVar9._8_8_ = local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[7];
    auVar9._0_8_ = local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[7];
    auVar9._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar9._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar9._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar9._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar9._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar9._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar30 = vmulpd_avx512f(local_480,auVar9);
    auVar31 = vaddpd_avx512f(auVar33,auVar34);
    auVar29 = vaddpd_avx512f(auVar29,auVar30);
    local_400[0] = (assign_op<double,_double>)auVar29[0];
    local_400[1] = (assign_op<double,_double>)auVar29[1];
    local_400[2] = (assign_op<double,_double>)auVar29[2];
    local_400[3] = (assign_op<double,_double>)auVar29[3];
    local_400[4] = (assign_op<double,_double>)auVar29[4];
    local_400[5] = (assign_op<double,_double>)auVar29[5];
    local_400[6] = (assign_op<double,_double>)auVar29[6];
    local_400[7] = (assign_op<double,_double>)auVar29[7];
    local_400[8] = (assign_op<double,_double>)auVar29[8];
    local_400[9] = (assign_op<double,_double>)auVar29[9];
    local_400[10] = (assign_op<double,_double>)auVar29[10];
    local_400[0xb] = (assign_op<double,_double>)auVar29[0xb];
    local_400[0xc] = (assign_op<double,_double>)auVar29[0xc];
    local_400[0xd] = (assign_op<double,_double>)auVar29[0xd];
    local_400[0xe] = (assign_op<double,_double>)auVar29[0xe];
    local_400[0xf] = (assign_op<double,_double>)auVar29[0xf];
    local_400[0x10] = (assign_op<double,_double>)auVar29[0x10];
    local_400[0x11] = (assign_op<double,_double>)auVar29[0x11];
    local_400[0x12] = (assign_op<double,_double>)auVar29[0x12];
    local_400[0x13] = (assign_op<double,_double>)auVar29[0x13];
    local_400[0x14] = (assign_op<double,_double>)auVar29[0x14];
    local_400[0x15] = (assign_op<double,_double>)auVar29[0x15];
    local_400[0x16] = (assign_op<double,_double>)auVar29[0x16];
    local_400[0x17] = (assign_op<double,_double>)auVar29[0x17];
    local_400[0x18] = (assign_op<double,_double>)auVar29[0x18];
    local_400[0x19] = (assign_op<double,_double>)auVar29[0x19];
    local_400[0x1a] = (assign_op<double,_double>)auVar29[0x1a];
    local_400[0x1b] = (assign_op<double,_double>)auVar29[0x1b];
    local_400[0x1c] = (assign_op<double,_double>)auVar29[0x1c];
    local_400[0x1d] = (assign_op<double,_double>)auVar29[0x1d];
    local_400[0x1e] = (assign_op<double,_double>)auVar29[0x1e];
    local_400[0x1f] = (assign_op<double,_double>)auVar29[0x1f];
    local_400[0x20] = (assign_op<double,_double>)auVar29[0x20];
    local_400[0x21] = (assign_op<double,_double>)auVar29[0x21];
    local_400[0x22] = (assign_op<double,_double>)auVar29[0x22];
    local_400[0x23] = (assign_op<double,_double>)auVar29[0x23];
    local_400[0x24] = (assign_op<double,_double>)auVar29[0x24];
    local_400[0x25] = (assign_op<double,_double>)auVar29[0x25];
    local_400[0x26] = (assign_op<double,_double>)auVar29[0x26];
    local_400[0x27] = (assign_op<double,_double>)auVar29[0x27];
    local_400[0x28] = (assign_op<double,_double>)auVar29[0x28];
    local_400[0x29] = (assign_op<double,_double>)auVar29[0x29];
    local_400[0x2a] = (assign_op<double,_double>)auVar29[0x2a];
    local_400[0x2b] = (assign_op<double,_double>)auVar29[0x2b];
    local_400[0x2c] = (assign_op<double,_double>)auVar29[0x2c];
    local_400[0x2d] = (assign_op<double,_double>)auVar29[0x2d];
    local_400[0x2e] = (assign_op<double,_double>)auVar29[0x2e];
    local_400[0x2f] = (assign_op<double,_double>)auVar29[0x2f];
    local_400[0x30] = (assign_op<double,_double>)auVar29[0x30];
    local_400[0x31] = (assign_op<double,_double>)auVar29[0x31];
    local_400[0x32] = (assign_op<double,_double>)auVar29[0x32];
    local_400[0x33] = (assign_op<double,_double>)auVar29[0x33];
    local_400[0x34] = (assign_op<double,_double>)auVar29[0x34];
    local_400[0x35] = (assign_op<double,_double>)auVar29[0x35];
    local_400[0x36] = (assign_op<double,_double>)auVar29[0x36];
    local_400[0x37] = (assign_op<double,_double>)auVar29[0x37];
    local_400[0x38] = (assign_op<double,_double>)auVar29[0x38];
    local_400[0x39] = (assign_op<double,_double>)auVar29[0x39];
    local_400[0x3a] = (assign_op<double,_double>)auVar29[0x3a];
    local_400[0x3b] = (assign_op<double,_double>)auVar29[0x3b];
    local_400[0x3c] = (assign_op<double,_double>)auVar29[0x3c];
    local_400[0x3d] = (assign_op<double,_double>)auVar29[0x3d];
    local_400[0x3e] = (assign_op<double,_double>)auVar29[0x3e];
    local_400[0x3f] = (assign_op<double,_double>)auVar29[0x3f];
    auVar10._8_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar10._0_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar10._16_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar10._24_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar10._32_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar10._40_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar10._48_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar10._56_8_ =
         local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar29 = vmulpd_avx512f(local_480,auVar10);
    local_440 = vaddpd_avx512f(auVar31,auVar29);
    if (5 < (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar21 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar18 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      uVar22 = 2;
      lVar19 = 0;
      pdVar5 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar23._8_8_ = 0x3fe0000000000000;
      auVar23._0_8_ = 0x3fe0000000000000;
      auVar23 = vmulpd_avx512vl(*(undefined1 (*) [16])(pdVar21 + 3),auVar23);
      dVar35 = pdVar21[5] * 0.5;
      auVar24 = vshufpd_avx(auVar23,auVar23,1);
      while ((long)(uVar22 - 2) < (long)uVar18) {
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(double *)(local_400 + lVar19);
        dVar36 = *(double *)(local_440 + lVar19);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar36;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(double *)(local_400 + lVar19) * -dVar35;
        auVar25 = vfmadd231sd_fma(auVar43,auVar24,auVar25);
        pdVar5[uVar22 - 2] = auVar25._0_8_ + pdVar5[uVar22 - 2];
        if (uVar18 <= uVar22 - 1) break;
        dVar2 = *(double *)(local_3c0 + lVar19);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = dVar2;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = dVar35;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = dVar36 * -auVar23._0_8_;
        auVar25 = vfmadd231sd_fma(auVar41,auVar37,auVar44);
        pdVar5[uVar22 - 1] = auVar25._0_8_ + pdVar5[uVar22 - 1];
        if (uVar18 <= uVar22) break;
        lVar19 = lVar19 + 8;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = dVar2 * -auVar24._0_8_;
        auVar25 = vfmadd213sd_fma(auVar40,auVar23,auVar42);
        pdVar5[uVar22] = auVar25._0_8_ + pdVar5[uVar22];
        uVar22 = uVar22 + 3;
        if (uVar22 == 0x1a) {
          auVar15._8_8_ = dStack_520;
          auVar15._0_8_ = local_528;
          auVar16._8_8_ = uStack_508;
          auVar16._0_8_ = local_510;
          auVar6._8_8_ = local_518;
          auVar6._0_8_ = local_518;
          auVar24 = vmulpd_avx512vl(auVar15,auVar6);
          auVar7._8_8_ = local_530;
          auVar7._0_8_ = local_530;
          auVar25 = vfmsub231pd_avx512vl(auVar24,auVar16,auVar7);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uStack_508;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = local_510 * dStack_520;
          auVar23 = vfmsub132sd_fma(auVar15,auVar39,auVar4);
          auVar24 = vpermilpd_avx(local_540,1);
          auVar38._0_8_ = auVar24._0_8_ * auVar25._0_8_;
          auVar38._8_8_ = auVar24._8_8_ * auVar25._8_8_;
          auVar24 = vshufpd_avx(auVar38,auVar38,1);
          *local_550 = auVar38._0_8_ + (auVar23._0_8_ * local_548 - auVar24._0_8_);
          return;
        }
      }
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementBeamANCF_3243::ComputeNF(
    const double xi,             // parametric coordinate in volume
    const double eta,            // parametric coordinate in volume
    const double zeta,           // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    // Compute the generalized force vector for the applied force component using the compact form of the shape
    // functions.  This requires a reshaping of the calculated matrix to get it into the correct vector order (just a
    // reinterpretation of the data since the matrix is in row-major format)
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);
    MatrixNx3 QiCompact;

    QiCompact = Sxi_compact * F.segment(0, 3).transpose();

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Qi = QiReshaped;

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    MatrixNx3c Sxi_D;
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_Cxi;
    ChMatrix33<double> J_Cxi_Inv;

    J_Cxi.noalias() = e_bar * Sxi_D;
    J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi((3 * i) + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi((3 * i) + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential volume and the normalized differential volume.  The determinate of the element Jacobian is
    //  used to calculate this volume ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.determinant();
}